

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncCastEmulation.cpp
# Opt level: O3

void __thiscall
wasm::ParallelFuncCastEmulation::visitCallIndirect
          (ParallelFuncCastEmulation *this,CallIndirect *curr)

{
  Expression **ppEVar1;
  Type type;
  Expression *pEVar2;
  ulong uVar3;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  ulong uVar4;
  undefined1 local_1c8 [392];
  size_t local_40;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *local_38;
  
  uVar3 = (curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  uVar4 = (ulong)this->numParams;
  if (uVar4 < uVar3) {
    Fatal::Fatal((Fatal *)local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8 + 0x10),"max-func-params needs to be at least ",0x25);
    local_40 = (curr->operands).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
               usedElements;
    Fatal::operator<<((Fatal *)local_1c8,&local_40);
    Fatal::~Fatal((Fatal *)local_1c8);
  }
  this_00 = &(curr->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>;
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = 0;
    local_38 = this_00;
    do {
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar4) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      ppEVar1 = local_38->data;
      pEVar2 = toABI(ppEVar1[uVar4],
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                     ).
                     super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                     .
                     super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                     .currModule);
      ppEVar1[uVar4] = pEVar2;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    uVar3 = (curr->operands).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    uVar4 = (ulong)this->numParams;
    this_00 = local_38;
  }
  if (uVar3 < uVar4) {
    do {
      pEVar2 = LiteralUtils::makeZero
                         ((Type)0x3,
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                          ).
                          super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          .
                          super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                          .currModule);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (this_00,pEVar2);
    } while ((curr->operands).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             < (ulong)this->numParams);
  }
  (curr->heapType).id = (this->ABIType).id;
  type.id = (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id;
  (curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 3;
  CallIndirect::finalize(curr);
  pEVar2 = fromABI((Expression *)curr,type,
                   (this->
                   super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                   ).
                   super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .
                   super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                   .currModule);
  Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>::
  replaceCurrent(&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>_>
                  ).
                  super_PostWalker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                  .
                  super_Walker<wasm::ParallelFuncCastEmulation,_wasm::Visitor<wasm::ParallelFuncCastEmulation,_void>_>
                 ,pEVar2);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    if (curr->operands.size() > numParams) {
      Fatal() << "max-func-params needs to be at least "
              << curr->operands.size();
    }
    for (Expression*& operand : curr->operands) {
      operand = toABI(operand, getModule());
    }
    // Add extra operands as needed.
    while (curr->operands.size() < numParams) {
      curr->operands.push_back(LiteralUtils::makeZero(Type::i64, *getModule()));
    }
    // Set the new types
    curr->heapType = ABIType;
    auto oldType = curr->type;
    curr->type = Type::i64;
    curr->finalize(); // may be unreachable
    // Fix up return value
    replaceCurrent(fromABI(curr, oldType, getModule()));
  }